

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

int __thiscall
cppqc::StatelessGenerator<std::vector<int,_std::allocator<int>_>_>::
StatelessGenModel<cppqc::detail::ListOfStatelessGenerator<int>_>::clone
          (StatelessGenModel<cppqc::detail::ListOfStatelessGenerator<int>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  ListOfStatelessGenerator<int> *in_stack_ffffffffffffffc8;
  ListOfStatelessGenerator<int> *in_stack_ffffffffffffffe8;
  StatelessGenModel<cppqc::detail::ListOfStatelessGenerator<int>_> *in_stack_fffffffffffffff0;
  
  pvVar1 = operator_new(0x10);
  detail::ListOfStatelessGenerator<int>::ListOfStatelessGenerator
            ((ListOfStatelessGenerator<int> *)this,in_stack_ffffffffffffffc8);
  StatelessGenModel(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  detail::ListOfStatelessGenerator<int>::~ListOfStatelessGenerator
            ((ListOfStatelessGenerator<int> *)0x11f2fc);
  return (int)pvVar1;
}

Assistant:

detail::StatelessGenConcept<T>* clone() const override {
      return new StatelessGenModel(m_obj);
    }